

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O3

int __thiscall Timidity::Renderer::allocate_voice(Renderer *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  Voice *pVVar5;
  float *pfVar6;
  float fVar7;
  
  uVar4 = this->voices;
  uVar3 = (ulong)(int)uVar4;
  if (0 < (long)uVar3) {
    pVVar5 = this->voice;
    uVar2 = 0;
    do {
      if ((pVVar5->status & 1) == 0) goto LAB_00355ff3;
      uVar2 = uVar2 + 1;
      pVVar5 = pVVar5 + 1;
    } while (uVar3 != uVar2);
  }
  if (uVar4 == 0) {
    iVar1 = -1;
  }
  else {
    pfVar6 = &this->voice[uVar3 - 1].attenuation;
    uVar2 = 0xffffffff;
    fVar7 = 1e+10;
    do {
      uVar4 = uVar4 - 1;
      if (((((Voice *)(pfVar6 + -0x32))->status & 0xc) == 4) && (*pfVar6 < fVar7)) {
        uVar2 = (ulong)uVar4;
        fVar7 = *pfVar6;
      }
      iVar1 = (int)uVar2;
      uVar3 = uVar3 - 1;
      pfVar6 = pfVar6 + -0x5c;
    } while (uVar3 != 0);
    if (-1 < iVar1) {
      this->cut_notes = this->cut_notes + 1;
      this->voice[uVar2].status = '\0';
LAB_00355ff3:
      return (int)uVar2;
    }
  }
  this->lost_notes = this->lost_notes + 1;
  return iVar1;
}

Assistant:

int Renderer::allocate_voice()
{
	int i, lowest;
	float lv, v;

	for (i = 0; i < voices; ++i)
	{
		if (!(voice[i].status & VOICE_RUNNING))
		{
			return i; /* Can't get a lower volume than silence */
		}
	}

	/* Look for the decaying note with the lowest volume */
	lowest = -1;
	lv = 1e10;
	i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RELEASING) && !(voice[i].status & VOICE_STOPPING))
		{
			v = voice[i].attenuation;
			if (v < lv)
			{
				lv = v;
				lowest = i;
			}
		}
	}

	if (lowest >= 0)
	{
		/* This can still cause a click, but if we had a free voice to
		   spare for ramping down this note, we wouldn't need to kill it
		   in the first place... Still, this needs to be fixed. Perhaps
		   we could use a reserve of voices to play dying notes only. */

		cut_notes++;
		voice[lowest].status = 0;
	}
	else
	{
		lost_notes++;
	}
	return lowest;
}